

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

GLuint __thiscall
gl4cts::GPUShaderFP64Test2::getAmountUniforms
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type)

{
  uint uVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  GPUShaderFP64Test2 *this_00;
  
  this_00 = this;
  GVar2 = getMaxUniformComponents(this,shader_stage);
  GVar3 = getRequiredComponentsNumber(this_00,uniform_type);
  GVar4 = getMaxUniformBlockSize(this);
  GVar5 = getUniformTypeMemberSize(this,uniform_type);
  uVar1 = GVar4 / GVar5;
  if (GVar2 / GVar3 <= GVar4 / GVar5) {
    uVar1 = GVar2 / GVar3;
  }
  return uVar1;
}

Assistant:

glw::GLuint GPUShaderFP64Test2::getAmountUniforms(shaderStage				shader_stage,
												  const uniformTypeDetails& uniform_type) const
{
	const glw::GLuint max_uniform_components   = getMaxUniformComponents(shader_stage);
	const glw::GLuint required_components	  = getRequiredComponentsNumber(uniform_type);
	const glw::GLuint n_uniforms			   = max_uniform_components / required_components;
	const glw::GLuint max_uniform_block_size   = getMaxUniformBlockSize();
	const glw::GLuint uniform_type_member_size = getUniformTypeMemberSize(uniform_type);
	const glw::GLuint max_uniforms			   = max_uniform_block_size / uniform_type_member_size;

	return max_uniforms < n_uniforms ? max_uniforms : n_uniforms;
}